

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UserInterface.cpp
# Opt level: O2

void __thiscall
DropdownMenu::DropdownMenu(DropdownMenu *this,TextButton *button,Color *backgroundColor)

{
  RectangleShape *this_00;
  Vector2f *pVVar1;
  Vector2f local_38;
  
  UIComponent::UIComponent(&this->super_UIComponent);
  (this->super_UIComponent).super_Drawable._vptr_Drawable =
       (_func_int **)&PTR__DropdownMenu_001c51a8;
  (this->super_UIComponent).super_Transformable._vptr_Transformable =
       (_func_int **)&PTR__DropdownMenu_001c51e0;
  TextButton::TextButton(&this->button);
  this_00 = &this->background;
  local_38.x = 0.0;
  local_38.y = 0.0;
  sf::RectangleShape::RectangleShape(this_00,&local_38);
  (this->menuButtons).super__Vector_base<TextButton,_std::allocator<TextButton>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->menuButtons).super__Vector_base<TextButton,_std::allocator<TextButton>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->menuButtons).super__Vector_base<TextButton,_std::allocator<TextButton>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  TextButton::operator=(&this->button,button);
  local_38.x = 0.0;
  local_38.y = 4.0;
  sf::RectangleShape::setSize(this_00,&local_38);
  sf::Shape::setFillColor(&this_00->super_Shape,backgroundColor);
  pVVar1 = sf::RectangleShape::getSize(&button->button);
  sf::Transformable::setPosition(&(this->background).super_Shape.super_Transformable,0.0,pVVar1->y);
  pVVar1 = sf::Transformable::getPosition(&(button->super_UIComponent).super_Transformable);
  sf::Transformable::setPosition(&(this->super_UIComponent).super_Transformable,pVVar1);
  sf::Transformable::setPosition(&(this->button).super_UIComponent.super_Transformable,0.0,0.0);
  this->maxMenuButtonWidth = 0.0;
  (this->super_UIComponent).super_Transformable.field_0xa9 = 0;
  return;
}

Assistant:

DropdownMenu::DropdownMenu(const TextButton& button, const Color& backgroundColor) {
    this->button = button;
    
    background.setSize(Vector2f(0.0f, 4.0f));
    background.setFillColor(backgroundColor);
    background.setPosition(0.0f, button.button.getSize().y);
    
    setPosition(button.getPosition());
    this->button.setPosition(0.0f, 0.0f);
    maxMenuButtonWidth = 0.0f;
    visible = false;
}